

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  bool bVar1;
  string *getter;
  char *__s;
  string *this_00;
  undefined1 local_60 [32];
  string local_40;
  
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    __s = "__p.__string";
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_ARRAY:
    local_60._0_4_ = type->element;
    local_60._24_2_ = type->fixed_length;
    local_60._4_4_ = BASE_TYPE_NONE;
    local_60._8_8_ = type->struct_def;
    local_60._16_8_ = type->enum_def;
    GenGetter_abi_cxx11_(__return_storage_ptr__,this,(Type *)local_60);
    return __return_storage_ptr__;
  case BASE_TYPE_STRUCT:
    __s = "__p.__struct";
    break;
  case BASE_TYPE_UNION:
    __s = "__p.__union";
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__p.bb.Get",(allocator<char> *)local_60);
    if (type->base_type == BASE_TYPE_BOOL) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "0!=",__return_storage_ptr__);
      this_00 = (string *)local_60;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_00);
    }
    else {
      GenTypeBasic_abi_cxx11_((string *)local_60,this,type,false);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60,"byte");
      std::__cxx11::string::~string((string *)local_60);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      GenTypeBasic_abi_cxx11_(&local_40,this,type,false);
      ConvertCase((string *)local_60,&local_40,kUpperCamel,kSnake);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_60);
      this_00 = &local_40;
    }
    std::__cxx11::string::~string((string *)this_00);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetter(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "__p.__string";
      case BASE_TYPE_STRUCT: return "__p.__struct";
      case BASE_TYPE_UNION: return "__p.__union";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      case BASE_TYPE_ARRAY: return GenGetter(type.VectorType());
      default: {
        std::string getter = "__p.bb.Get";
        if (type.base_type == BASE_TYPE_BOOL) {
          getter = "0!=" + getter;
        } else if (GenTypeBasic(type, false) != "byte") {
          getter += ConvertCase(GenTypeBasic(type, false), Case::kUpperCamel);
        }
        return getter;
      }
    }
  }